

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSMC.h
# Opt level: O1

void __thiscall
chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>::
CreateJacobians(ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_> *this)

{
  double *pdVar1;
  ChContactable_1vars<6> *pCVar2;
  ChContactable_1vars<3> *pCVar3;
  int iVar4;
  int iVar5;
  ChContactJacobian *pCVar6;
  undefined4 extraout_var;
  long lVar7;
  undefined4 extraout_var_00;
  long *plVar8;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> vars;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_78;
  ChMatrixRef local_60;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_38;
  
  pCVar6 = this->m_Jac;
  if (pCVar6 != (ChContactJacobian *)0x0) {
    pdVar1 = (pCVar6->m_R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
             m_storage.m_data;
    if (pdVar1 != (double *)0x0) {
      free((void *)pdVar1[-1]);
    }
    pdVar1 = (pCVar6->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
             m_storage.m_data;
    if (pdVar1 != (double *)0x0) {
      free((void *)pdVar1[-1]);
    }
    ChKblockGeneric::~ChKblockGeneric(&pCVar6->m_KRM);
    operator_delete(pCVar6,0x68);
  }
  pCVar6 = (ChContactJacobian *)::operator_new(0x68);
  (pCVar6->m_KRM).super_ChKblock._vptr_ChKblock = (_func_int **)&PTR__ChKblockGeneric_00b62688;
  (pCVar6->m_KRM).K.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (pCVar6->m_KRM).K.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_rows = 0;
  (pCVar6->m_KRM).K.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_cols = 0;
  (pCVar6->m_KRM).variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pCVar6->m_KRM).variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pCVar6->m_KRM).variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pCVar6->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (pCVar6->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows =
       0;
  (pCVar6->m_KRM).variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pCVar6->m_KRM).variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pCVar6->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (pCVar6->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows =
       0;
  (pCVar6->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols =
       0;
  (pCVar6->m_R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (pCVar6->m_R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows =
       0;
  (pCVar6->m_R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols =
       0;
  this->m_Jac = pCVar6;
  local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
  .super__Vector_impl_data._0_16_ = ZEXT416(0) << 0x40;
  local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (ChVariables **)0x0;
  pCVar2 = (this->
           super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>).
           objA;
  iVar4 = (*(pCVar2->super_ChVariableTupleCarrier_1vars<6>)._vptr_ChVariableTupleCarrier_1vars[2])
                    (&pCVar2->super_ChVariableTupleCarrier_1vars<6>);
  local_60.
  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>.
  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  .
  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
  .m_data = (PointerType)CONCAT44(extraout_var,iVar4);
  if (local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
    _M_realloc_insert<chrono::ChVariables*>
              ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_78,
               (iterator)
               local_78.
               super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
               _M_impl.super__Vector_impl_data._M_finish,(ChVariables **)&local_60);
  }
  else {
    *local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
     _M_impl.super__Vector_impl_data._M_finish =
         (ChVariables *)
         local_60.
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
         .m_data;
    local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  pCVar2 = (this->
           super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>).
           objA;
  if (pCVar2 == (ChContactable_1vars<6> *)0x0) {
    lVar7 = 0;
  }
  else {
    lVar7 = __dynamic_cast(pCVar2,&ChContactable_1vars<6>::typeinfo,
                           &ChContactable_3vars<3,3,3>::typeinfo,0xfffffffffffffffe);
  }
  if (lVar7 != 0) {
    plVar8 = (long *)(lVar7 + 0x18);
    local_60.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = (PointerType)(**(code **)(*(long *)(lVar7 + 0x18) + 0x18))(plVar8);
    if (local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
      _M_realloc_insert<chrono::ChVariables*>
                ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_78,
                 (iterator)
                 local_78.
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(ChVariables **)&local_60);
    }
    else {
      *local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
       _M_impl.super__Vector_impl_data._M_finish =
           (ChVariables *)
           local_60.
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_data;
      local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_78.
           super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
           .super__Vector_impl_data._M_finish + 1;
    }
    local_60.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = (PointerType)(**(code **)(*plVar8 + 0x20))(plVar8);
    if (local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
      _M_realloc_insert<chrono::ChVariables*>
                ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_78,
                 (iterator)
                 local_78.
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(ChVariables **)&local_60);
    }
    else {
      *local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
       _M_impl.super__Vector_impl_data._M_finish =
           (ChVariables *)
           local_60.
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_data;
      local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_78.
           super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
           .super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar4 = (*(((this->
              super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>)
             .objA)->super_ChContactable)._vptr_ChContactable[4])();
  pCVar3 = (this->
           super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>).
           objB;
  iVar5 = (*(pCVar3->super_ChVariableTupleCarrier_1vars<3>)._vptr_ChVariableTupleCarrier_1vars[2])
                    (&pCVar3->super_ChVariableTupleCarrier_1vars<3>);
  local_60.
  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>.
  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  .
  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
  .m_data = (PointerType)CONCAT44(extraout_var_00,iVar5);
  if (local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
    _M_realloc_insert<chrono::ChVariables*>
              ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_78,
               (iterator)
               local_78.
               super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
               _M_impl.super__Vector_impl_data._M_finish,(ChVariables **)&local_60);
  }
  else {
    *local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
     _M_impl.super__Vector_impl_data._M_finish =
         (ChVariables *)
         local_60.
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
         .m_data;
    local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  pCVar3 = (this->
           super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>).
           objB;
  if (pCVar3 == (ChContactable_1vars<3> *)0x0) {
    lVar7 = 0;
  }
  else {
    lVar7 = __dynamic_cast(pCVar3,&ChContactable_1vars<3>::typeinfo,
                           &ChContactable_3vars<3,3,3>::typeinfo,0xfffffffffffffffe);
  }
  if (lVar7 != 0) {
    plVar8 = (long *)(lVar7 + 0x18);
    local_60.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = (PointerType)(**(code **)(*(long *)(lVar7 + 0x18) + 0x18))(plVar8);
    if (local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
      _M_realloc_insert<chrono::ChVariables*>
                ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_78,
                 (iterator)
                 local_78.
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(ChVariables **)&local_60);
    }
    else {
      *local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
       _M_impl.super__Vector_impl_data._M_finish =
           (ChVariables *)
           local_60.
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_data;
      local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_78.
           super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
           .super__Vector_impl_data._M_finish + 1;
    }
    local_60.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = (PointerType)(**(code **)(*plVar8 + 0x20))(plVar8);
    if (local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
      _M_realloc_insert<chrono::ChVariables*>
                ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_78,
                 (iterator)
                 local_78.
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(ChVariables **)&local_60);
    }
    else {
      *local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
       _M_impl.super__Vector_impl_data._M_finish =
           (ChVariables *)
           local_60.
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_data;
      local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_78.
           super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
           .super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar5 = (*(((this->
              super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>)
             .objB)->super_ChContactable)._vptr_ChContactable[4])();
  pCVar6 = this->m_Jac;
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::vector
            (&local_38,&local_78);
  ChKblockGeneric::SetVariables(&pCVar6->m_KRM,&local_38);
  if (local_38.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  lVar7 = (long)(iVar5 + iVar4);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->m_Jac->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,
             lVar7,lVar7);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->m_Jac->m_R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,
             lVar7,lVar7);
  ChKblockGeneric::Get_K(&local_60,&this->m_Jac->m_KRM);
  if (local_60.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value == lVar7) {
    if (local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  __assert_fail("m_Jac->m_KRM.Get_K().cols() == ndof_w",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChContactSMC.h"
                ,0x233,
                "void chrono::ChContactSMC<chrono::ChContactable_1vars<6>, chrono::ChContactable_1vars<3>>::CreateJacobians() [Ta = chrono::ChContactable_1vars<6>, Tb = chrono::ChContactable_1vars<3>]"
               );
}

Assistant:

void CreateJacobians() {
        delete m_Jac;
        m_Jac = new ChContactJacobian;

        // Set variables and resize Jacobian matrices.
        // NOTE: currently, only contactable objects derived from ChContactable_1vars<6>,
        //       ChContactable_1vars<3>, and ChContactable_3vars<3,3,3> are supported.
        int ndof_w = 0;
        std::vector<ChVariables*> vars;

        vars.push_back(this->objA->GetVariables1());
        if (auto objA_333 = dynamic_cast<ChContactable_3vars<3, 3, 3>*>(this->objA)) {
            vars.push_back(objA_333->GetVariables2());
            vars.push_back(objA_333->GetVariables3());
        }
        ndof_w += this->objA->ContactableGet_ndof_w();

        vars.push_back(this->objB->GetVariables1());
        if (auto objB_333 = dynamic_cast<ChContactable_3vars<3, 3, 3>*>(this->objB)) {
            vars.push_back(objB_333->GetVariables2());
            vars.push_back(objB_333->GetVariables3());
        }
        ndof_w += this->objB->ContactableGet_ndof_w();

        m_Jac->m_KRM.SetVariables(vars);
        m_Jac->m_K.setZero(ndof_w, ndof_w);
        m_Jac->m_R.setZero(ndof_w, ndof_w);
        assert(m_Jac->m_KRM.Get_K().cols() == ndof_w);
    }